

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

bool __thiscall QTreeView::viewportEvent(QTreeView *this,QEvent *event)

{
  int iVar1;
  QTreeViewPrivate *this_00;
  bool bVar2;
  int iVar3;
  QWidget *this_01;
  QHoverEvent *he;
  long in_FS_OFFSET;
  QPointF QVar4;
  QRect local_70;
  QPoint local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ushort *)(event + 8) - 0x7f < 3) {
    this_00 = *(QTreeViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    iVar1 = this_00->hoverBranch;
    QVar4 = QSinglePointEvent::position((QSinglePointEvent *)event);
    puStack_50 = (undefined1 *)QVar4.yp;
    local_58 = (undefined1 *)QVar4.xp;
    local_70._0_8_ = QPointF::toPoint((QPointF *)&local_58);
    iVar3 = QTreeViewPrivate::itemDecorationAt(this_00,(QPoint *)&local_70);
    this_00->hoverBranch = iVar3;
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)event);
    local_60 = QPointF::toPoint((QPointF *)&local_70);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))((QModelIndex *)&local_58,this);
    bVar2 = ::operator!=(&(this_00->super_QAbstractItemViewPrivate).hover,(QModelIndex *)&local_58);
    if ((bVar2) || (this_00->hoverBranch != iVar1)) {
      this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      local_70 = QTreeViewPrivate::visualRect(this_00,(QModelIndex *)&local_58,FullRow);
      QWidget::update(this_01,&local_70);
    }
  }
  bVar2 = QAbstractItemView::viewportEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeView::viewportEvent(QEvent *event)
{
    Q_D(QTreeView);
    switch (event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove: {
        QHoverEvent *he = static_cast<QHoverEvent*>(event);
        const int oldBranch = d->hoverBranch;
        d->hoverBranch = d->itemDecorationAt(he->position().toPoint());
        QModelIndex newIndex = indexAt(he->position().toPoint());
        if (d->hover != newIndex || d->hoverBranch != oldBranch) {
            // Update the whole hovered over row. No need to update the old hovered
            // row, that is taken care in superclass hover handling.
            viewport()->update(d->visualRect(newIndex, QTreeViewPrivate::FullRow));
        }
        break; }
    default:
        break;
    }
    return QAbstractItemView::viewportEvent(event);
}